

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_Random.h
# Opt level: O0

string * __thiscall
BGIP_SolverCreator_Random::SoftPrintBrief_abi_cxx11_(BGIP_SolverCreator_Random *this)

{
  ostream *this_00;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = std::operator<<(local_188,"BGIPSC_Random_nrSol");
  std::ostream::operator<<(this_00,*(ulong *)(in_RSI + 0x10));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SoftPrintBrief() const
        {
            std::stringstream ss;
            ss << "BGIPSC_Random_nrSol" << _m_nrSolutions;
            return(ss.str());
        }